

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void session(socket *socket,shared_ptr<KeyValueStore> *k)

{
  bool bVar1;
  runtime_error *this;
  error_code ec;
  char data [24];
  error_code local_b8;
  error_code local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  
  boost::system::error_code::error_code(&local_b8);
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  boost::asio::detail::socket_ops::sync_recv1
            ((socket->
             super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             ).impl_.implementation_.super_base_implementation_type.socket_,
             (socket->
             super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             ).impl_.implementation_.super_base_implementation_type.state_,&local_98,0x18,0,
             &local_b8);
  boost::system::error_code::error_code<boost::asio::error::misc_errors>(&local_a8,eof,(type *)0x0);
  if (local_b8.val_ == local_a8.val_) {
    bVar1 = (local_b8.cat_)->id_ == (local_a8.cat_)->id_;
    if ((local_a8.cat_)->id_ == 0) {
      bVar1 = local_b8.cat_ == local_a8.cat_;
    }
    if (bVar1) {
      return;
    }
  }
  if (local_b8.failed_ != true) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x40);
  std::runtime_error::runtime_error(this,"");
  *(undefined ***)this = &PTR__system_error_0012c130;
  *(ulong *)(this + 0x10) = CONCAT44(local_b8._4_4_,local_b8.val_);
  *(error_category **)(this + 0x18) = local_b8.cat_;
  *(runtime_error **)(this + 0x20) = this + 0x30;
  *(undefined8 *)(this + 0x28) = 0;
  this[0x30] = (runtime_error)0x0;
  __cxa_throw(this,&boost::system::system_error::typeinfo,boost::system::system_error::~system_error
             );
}

Assistant:

void session(tcp::socket socket, const std::shared_ptr<KeyValueStore>& k) {
  boost::system::error_code ec;
  try {
    for (;;) {
      char data[Packet::HEADER_LENGTH] = { 0 };
      size_t bytes_read = socket.read_some(boost::asio::buffer(data), ec);
      if (ec == boost::asio::error::eof) {
        return;
      } else if (ec) {
        throw boost::system::system_error(ec);
      } else if (data[0] != Packet::MAGIC ||
                 bytes_read < Packet::HEADER_LENGTH) {
        return;
      }
      Packet(data, socket, k);
    }
  } catch (std::exception& e) {
    std::cerr << "Exception in thread: " << e.what() << std::endl;
  }
}